

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool storeRawNames(XML_Parser parser)

{
  TAG *pTVar1;
  char *pcVar2;
  XML_Char *pXVar3;
  XML_Char *pXVar4;
  size_t __n;
  long lVar5;
  char *pcVar6;
  char *__dest;
  size_t sVar7;
  
  pTVar1 = parser->m_tagStack;
  while( true ) {
    if (pTVar1 == (TAG *)0x0) {
      return '\x01';
    }
    lVar5 = (long)(pTVar1->name).strLen;
    pcVar6 = pTVar1->rawName;
    pcVar2 = pTVar1->buf;
    __dest = pcVar2 + lVar5 + 1;
    if (pcVar6 == __dest) break;
    lVar5 = lVar5 + 1;
    __n = (size_t)pTVar1->rawNameLength;
    if (0x7fffffffU - lVar5 < __n) {
      return '\0';
    }
    sVar7 = (size_t)(pTVar1->rawNameLength + (int)lVar5);
    if ((long)pTVar1->bufEnd - (long)pcVar2 < (long)sVar7) {
      pXVar4 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pcVar2,sVar7);
      if (pXVar4 == (XML_Char *)0x0) {
        return '\0';
      }
      pcVar6 = pTVar1->buf;
      if ((pTVar1->name).str == pcVar6) {
        (pTVar1->name).str = pXVar4;
      }
      pXVar3 = (pTVar1->name).localPart;
      if (pXVar3 != (XML_Char *)0x0) {
        (pTVar1->name).localPart = pXVar4 + ((long)pXVar3 - (long)pcVar6);
      }
      pTVar1->buf = pXVar4;
      pTVar1->bufEnd = pXVar4 + sVar7;
      __dest = pXVar4 + lVar5;
      pcVar6 = pTVar1->rawName;
      __n = (size_t)pTVar1->rawNameLength;
    }
    memcpy(__dest,pcVar6,__n);
    pTVar1->rawName = __dest;
    pTVar1 = pTVar1->parent;
  }
  return '\x01';
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser) {
  TAG *tag = parser->m_tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    size_t rawNameLen;
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since m_tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    rawNameLen = ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    /* Detect and prevent integer overflow. */
    if (rawNameLen > (size_t)INT_MAX - nameLen)
      return XML_FALSE;
    bufSize = nameLen + (int)rawNameLen;
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart
            = (XML_Char *)temp + (tag->name.localPart - (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}